

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

bool efsw::FileInfo::isLink(string *filePath)

{
  bool bVar1;
  undefined1 local_58 [8];
  FileInfo fi;
  string *filePath_local;
  
  fi.Inode = (Uint64)filePath;
  FileInfo((FileInfo *)local_58,filePath,true);
  bVar1 = isLink((FileInfo *)local_58);
  ~FileInfo((FileInfo *)local_58);
  return bVar1;
}

Assistant:

bool FileInfo::isLink( const std::string& filePath ) {
	FileInfo fi( filePath, true );
	return fi.isLink();
}